

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_7c221d::Target::DumpSysroot
          (Value *__return_storage_ptr__,Target *this,string *path)

{
  Value *this_00;
  Value local_50;
  undefined1 local_21;
  string *local_20;
  string *path_local;
  Target *this_local;
  Value *sysroot;
  
  local_21 = 0;
  local_20 = path;
  path_local = (string *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_50,local_20);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"path");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpSysroot(std::string const& path)
{
  Json::Value sysroot = Json::objectValue;
  sysroot["path"] = path;
  return sysroot;
}